

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O2

_Bool borg_target(loc_conflict t)

{
  borg_kill *pbVar1;
  ulong uVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  pbVar1 = borg_kills;
  iVar4 = t.x;
  uVar2 = (ulong)borg_grids[(long)t >> 0x20][iVar4].kill;
  iVar6 = t.y;
  if (uVar2 == 0) {
    pcVar3 = format("# Targetting location (%d,%d)",(ulong)t >> 0x20,(ulong)t & 0xffffffff);
  }
  else {
    pcVar3 = borg_race_name((uint)borg_kills[uVar2].r_idx);
    pcVar3 = format("# Targeting %s who has %d Hit Points (%d,%d).",pcVar3,
                    (ulong)(uint)(int)pbVar1[uVar2].power,(ulong)t >> 0x20,(ulong)t & 0xffffffff);
  }
  borg_note(pcVar3);
  borg_keypress(0x2a);
  borg_keypress(0x70);
  iVar5 = borg.c.y;
  for (iVar7 = borg.c.x; (iVar5 < iVar6 && (iVar7 < iVar4)); iVar7 = iVar7 + 1) {
    borg_keypress(0x33);
    iVar5 = iVar5 + 1;
  }
  for (; (iVar5 < iVar6 && (iVar4 < iVar7)); iVar7 = iVar7 + -1) {
    borg_keypress(0x31);
    iVar5 = iVar5 + 1;
  }
  for (; (iVar6 < iVar5 && (iVar7 < iVar4)); iVar7 = iVar7 + 1) {
    borg_keypress(0x39);
    iVar5 = iVar5 + -1;
  }
  for (; (iVar6 < iVar5 && (iVar4 < iVar7)); iVar7 = iVar7 + -1) {
    borg_keypress(0x37);
    iVar5 = iVar5 + -1;
  }
  for (; iVar5 < iVar6; iVar5 = iVar5 + 1) {
    borg_keypress(0x32);
  }
  for (; iVar6 < iVar5; iVar5 = iVar5 + -1) {
    borg_keypress(0x38);
  }
  for (; iVar7 < iVar4; iVar7 = iVar7 + 1) {
    borg_keypress(0x36);
  }
  for (; iVar4 < iVar7; iVar7 = iVar7 + -1) {
    borg_keypress(0x34);
  }
  borg_keypress(0x35);
  borg_target_loc.y = iVar6;
  borg_target_loc.x = iVar4;
  return true;
}

Assistant:

bool borg_target(struct loc t)
{
    int x1, y1, x2, y2;

    borg_grid *ag;
    borg_kill *kill;

    ag   = &borg_grids[t.y][t.x];
    kill = &borg_kills[ag->kill];

    /* Log */
    /* Report a little bit */
    if (ag->kill) {
        borg_note(format("# Targeting %s who has %d Hit Points (%d,%d).",
            borg_race_name(kill->r_idx), kill->power, t.y, t.x));
    } else {
        borg_note(format("# Targetting location (%d,%d)", t.y, t.x));
    }

    /* Target mode */
    borg_keypress('*');

    /* Target a location */
    borg_keypress('p');

    /* Determine "path" */
    x1 = borg.c.x;
    y1 = borg.c.y;
    x2 = t.x;
    y2 = t.y;

    /* Move to the location (diagonals) */
    for (; (y1 < y2) && (x1 < x2); y1++, x1++)
        borg_keypress('3');
    for (; (y1 < y2) && (x1 > x2); y1++, x1--)
        borg_keypress('1');
    for (; (y1 > y2) && (x1 < x2); y1--, x1++)
        borg_keypress('9');
    for (; (y1 > y2) && (x1 > x2); y1--, x1--)
        borg_keypress('7');

    /* Move to the location */
    for (; y1 < y2; y1++)
        borg_keypress('2');
    for (; y1 > y2; y1--)
        borg_keypress('8');
    for (; x1 < x2; x1++)
        borg_keypress('6');
    for (; x1 > x2; x1--)
        borg_keypress('4');

    /* Select the target */
    borg_keypress('5');

    /* Carry these variables to be used on reporting spell
     * pathway
     */
    borg_target_loc.y = t.y;
    borg_target_loc.x = t.x;

    /* Success */
    return true;
}